

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void xm_note_off(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  byte bVar1;
  IT_PLAYING *playing;
  
  playing = channel->playing;
  if (playing != (IT_PLAYING *)0x0) {
    bVar1 = channel->instrument;
    if (((bVar1 == 0) || (sigdata->n_instruments < (int)(uint)bVar1)) ||
       ((sigdata->instrument[(ulong)(uint)bVar1 - 1].volume_envelope.flags & 1) == 0)) {
      channel->volume = '\0';
    }
    *(byte *)&playing->flags = (byte)playing->flags | 6;
    it_playing_update_resamplers(playing);
    return;
  }
  return;
}

Assistant:

static void xm_note_off(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	if (channel->playing) {
		if (!channel->instrument || channel->instrument > sigdata->n_instruments ||
			!(sigdata->instrument[channel->instrument-1].volume_envelope.flags & IT_ENVELOPE_ON))
			//if (!(entry->mask & IT_ENTRY_INSTRUMENT))
			// dunno what that was there for ...
				channel->volume = 0;
		channel->playing->flags |= IT_PLAYING_SUSTAINOFF | IT_PLAYING_FADING;
		it_playing_update_resamplers(channel->playing);
	}
}